

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O3

int yaml_emitter_write_tag_handle(yaml_emitter_t *emitter,yaml_char_t *value,size_t length)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  yaml_char_t *pyVar4;
  byte *pbVar5;
  
  if (emitter->whitespace == 0) {
    pyVar4 = (emitter->buffer).pointer;
    if ((emitter->buffer).end <= pyVar4 + 5) {
      iVar3 = yaml_emitter_flush(emitter);
      if (iVar3 == 0) {
        return 0;
      }
      pyVar4 = (emitter->buffer).pointer;
    }
    (emitter->buffer).pointer = pyVar4 + 1;
    *pyVar4 = ' ';
    emitter->column = emitter->column + 1;
  }
  if (length != 0) {
    pbVar5 = value + length;
    do {
      if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
         (iVar3 = yaml_emitter_flush(emitter), iVar3 == 0)) {
        return 0;
      }
      bVar2 = *value;
      if ((char)bVar2 < '\0') {
        if ((bVar2 & 0xe0) == 0xc0) {
          pbVar1 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar1 + 1;
          *pbVar1 = bVar2;
          bVar2 = value[1];
          value = value + 2;
          goto LAB_001089e7;
        }
        if ((bVar2 & 0xf0) == 0xe0) {
          pbVar1 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar1 + 1;
          *pbVar1 = bVar2;
          bVar2 = value[1];
          pbVar1 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar1 + 1;
          *pbVar1 = bVar2;
          bVar2 = value[2];
          value = value + 3;
          goto LAB_001089e7;
        }
        if ((bVar2 & 0xf8) == 0xf0) {
          pbVar1 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar1 + 1;
          *pbVar1 = bVar2;
          bVar2 = value[1];
          pbVar1 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar1 + 1;
          *pbVar1 = bVar2;
          bVar2 = value[2];
          pbVar1 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar1 + 1;
          *pbVar1 = bVar2;
          bVar2 = value[3];
          value = value + 4;
          goto LAB_001089e7;
        }
      }
      else {
        value = value + 1;
LAB_001089e7:
        pbVar1 = (emitter->buffer).pointer;
        (emitter->buffer).pointer = pbVar1 + 1;
        *pbVar1 = bVar2;
      }
      emitter->column = emitter->column + 1;
    } while (value != pbVar5);
  }
  emitter->whitespace = 0;
  emitter->indention = 0;
  return 1;
}

Assistant:

static int
yaml_emitter_write_tag_handle(yaml_emitter_t *emitter,
        yaml_char_t *value, size_t length)
{
    yaml_string_t string;
    STRING_ASSIGN(string, value, length);

    if (!emitter->whitespace) {
        if (!PUT(emitter, ' ')) return 0;
    }

    while (string.pointer != string.end) {
        if (!WRITE(emitter, string)) return 0;
    }

    emitter->whitespace = 0;
    emitter->indention = 0;

    return 1;
}